

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

int __thiscall
CVmObjDict::getp_correct(CVmObjDict *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *this_00;
  ushort uVar1;
  undefined4 uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  vm_datatype_t *pvVar10;
  vm_val_t *pvVar11;
  int iVar12;
  int iVar13;
  vm_obj_id_t vVar14;
  vm_obj_id_t vVar15;
  ushort *puVar16;
  size_t sVar17;
  wchar_t *buf;
  undefined8 *__ptr;
  long *plVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 *puVar21;
  CVmObjList *this_01;
  uint uVar22;
  wchar_t *pwVar23;
  long *plVar24;
  corr_state *ret;
  vm_val_t val;
  utf8_ptr rp;
  undefined8 *local_a8;
  vm_val_t local_78;
  utf8_ptr local_68;
  ulong local_60;
  long *local_58;
  ulong local_50;
  vm_val_t *local_48;
  undefined8 *local_40;
  long *local_38;
  
  if (getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_correct();
  }
  iVar12 = CVmObject::get_prop_check_argc(retval,argc,&getp_correct::desc);
  if (iVar12 == 0) {
    local_48 = retval;
    puVar16 = (ushort *)CVmBif::pop_str_val();
    iVar12 = CVmBif::pop_int_val();
    uVar1 = *puVar16;
    local_50 = 0;
    sVar17 = utf8_ptr::to_wchar((wchar_t *)0x0,0,(char *)(puVar16 + 1),(ulong)uVar1);
    buf = (wchar_t *)operator_new__(-(ulong)(sVar17 + 1 >> 0x3e != 0) | sVar17 * 4 + 4);
    utf8_ptr::to_wcharz(buf,sVar17 + 1,(char *)(puVar16 + 1),(ulong)uVar1);
    pcVar4 = (this->super_CVmObject).ext_;
    local_58 = (long *)0x0;
    if (*(int *)(pcVar4 + 0x30) == 1) {
      local_58 = *(long **)(pcVar4 + 0x28);
      local_50 = (**(code **)(*local_58 + 0x1f0))();
    }
    if (*(long *)((this->super_CVmObject).ext_ + 0x38) == 0) {
      build_trie(this);
    }
    uVar5 = *(undefined8 *)((this->super_CVmObject).ext_ + 0x38);
    __ptr = (undefined8 *)malloc(0x38);
    __ptr[5] = 0;
    __ptr[1] = 0;
    __ptr[2] = 0;
    __ptr[3] = uVar5;
    *(undefined4 *)(__ptr + 4) = 0;
    local_60 = 0;
    *__ptr = 0;
    plVar24 = (long *)0x0;
    do {
      puVar6 = (undefined8 *)*__ptr;
      if ((*(int *)(__ptr[3] + 4) != 0) && (__ptr[2] == sVar17)) {
        if (plVar24 != (long *)0x0) {
          lVar7 = __ptr[5];
          plVar18 = plVar24;
          do {
            if ((plVar18[2] == lVar7) &&
               (iVar13 = bcmp(plVar18 + 3,__ptr + 6,lVar7 * 4), iVar13 == 0)) goto LAB_00249030;
            plVar18 = (long *)*plVar18;
          } while (plVar18 != (long *)0x0);
        }
        lVar7 = __ptr[5];
        plVar18 = (long *)malloc(lVar7 * 4 + 0x1c);
        lVar8 = __ptr[1];
        memcpy(plVar18 + 3,__ptr + 6,lVar7 * 4);
        plVar18[2] = lVar7;
        plVar18[1] = lVar8;
        *plVar18 = (long)plVar24;
        plVar24 = plVar18;
LAB_00249030:
        iVar13 = *(int *)(__ptr + 1);
        if ((iVar13 < (int)plVar18[1]) ||
           ((iVar13 == (int)plVar18[1] &&
            (*(int *)((long)__ptr + 0xc) < *(int *)((long)plVar18 + 0xc))))) {
          *(int *)(plVar18 + 1) = iVar13;
          *(undefined4 *)((long)plVar18 + 0xc) = *(undefined4 *)((long)__ptr + 0xc);
        }
      }
      iVar13 = *(int *)(__ptr + 1);
      local_a8 = puVar6;
      local_38 = plVar24;
      if (((iVar13 < iVar12) && (uVar19 = __ptr[2], uVar19 < sVar17)) && (*(int *)(__ptr + 4) != 2))
      {
        local_40 = __ptr + 6;
        lVar7 = __ptr[5];
        uVar2 = *(undefined4 *)((long)__ptr + 0xc);
        uVar5 = __ptr[3];
        local_a8 = (undefined8 *)malloc(lVar7 * 4 + 0x38);
        memcpy(local_a8 + 6,local_40,lVar7 * 4);
        local_a8[5] = lVar7;
        *(int *)(local_a8 + 1) = iVar13 + 1;
        *(undefined4 *)((long)local_a8 + 0xc) = uVar2;
        local_a8[2] = uVar19 + 1;
        local_a8[3] = uVar5;
        *(undefined4 *)(local_a8 + 4) = 1;
        *local_a8 = puVar6;
      }
      pwVar23 = *(wchar_t **)(__ptr[3] + 8);
      if (pwVar23 != (wchar_t *)0x0) {
        puVar6 = __ptr + 6;
        do {
          *(wchar_t *)((long)__ptr + __ptr[5] * 4 + 0x30) = *pwVar23;
          uVar19 = __ptr[2];
          bVar9 = sVar17 <= uVar19;
          if (uVar19 < sVar17) {
            if (local_58 == (long *)0x0) {
              uVar19 = (ulong)(buf[uVar19] == *pwVar23);
            }
            else {
              uVar19 = (**(code **)(*local_58 + 0x1e8))();
            }
            if (uVar19 != 0) {
              uVar20 = __ptr[5];
              uVar19 = uVar19 + __ptr[2];
              goto LAB_002491b0;
            }
LAB_0024921b:
            bVar9 = true;
          }
          else {
            if (((local_50 == 0) || (uVar19 < local_50)) || (uVar20 = __ptr[5], uVar20 < local_50))
            goto LAB_0024921b;
LAB_002491b0:
            uVar5 = __ptr[1];
            puVar21 = (undefined8 *)malloc(uVar20 * 4 + 0x3c);
            memcpy(puVar21 + 6,puVar6,uVar20 * 4 + 4);
            puVar21[5] = uVar20 + 1;
            puVar21[1] = uVar5;
            puVar21[2] = uVar19;
            puVar21[3] = pwVar23;
            *(undefined4 *)(puVar21 + 4) = 0;
            *puVar21 = local_a8;
            local_a8 = puVar21;
          }
          iVar13 = *(int *)(__ptr + 1);
          if (iVar13 < iVar12) {
            uVar19 = __ptr[2];
            if (!(bool)(bVar9 ^ 1U | sVar17 <= uVar19)) {
              lVar7 = __ptr[5];
              iVar3 = *(int *)((long)__ptr + 0xc);
              puVar21 = (undefined8 *)malloc(lVar7 * 4 + 0x3c);
              memcpy(puVar21 + 6,puVar6,lVar7 * 4 + 4);
              puVar21[5] = lVar7 + 1;
              *(int *)(puVar21 + 1) = iVar13 + 1;
              *(int *)((long)puVar21 + 0xc) = iVar3 + 1;
              puVar21[2] = uVar19 + 1;
              puVar21[3] = pwVar23;
              *(undefined4 *)(puVar21 + 4) = 3;
              *puVar21 = local_a8;
              local_a8 = puVar21;
            }
            if (*(int *)(__ptr + 4) != 1) {
              lVar7 = __ptr[5];
              iVar13 = *(int *)(__ptr + 1);
              uVar2 = *(undefined4 *)((long)__ptr + 0xc);
              uVar5 = __ptr[2];
              puVar21 = (undefined8 *)malloc(lVar7 * 4 + 0x3c);
              memcpy(puVar21 + 6,puVar6,lVar7 * 4 + 4);
              puVar21[5] = lVar7 + 1;
              *(int *)(puVar21 + 1) = iVar13 + 1;
              *(undefined4 *)((long)puVar21 + 0xc) = uVar2;
              puVar21[2] = uVar5;
              puVar21[3] = pwVar23;
              *(undefined4 *)(puVar21 + 4) = 2;
              *puVar21 = local_a8;
              local_a8 = puVar21;
            }
          }
          if (((*(int *)(__ptr + 4) == 3) && (uVar19 = __ptr[2], uVar19 < sVar17 && uVar19 != 0)) &&
             ((buf[uVar19 - 1] == *pwVar23 &&
              (lVar7 = __ptr[5], buf[uVar19] == *(wchar_t *)((long)__ptr + lVar7 * 4 + 0x2c))))) {
            uVar2 = *(undefined4 *)(__ptr + 1);
            iVar13 = *(int *)((long)__ptr + 0xc);
            puVar21 = (undefined8 *)malloc(lVar7 * 4 + 0x3c);
            memcpy(puVar21 + 6,puVar6,lVar7 * 4 + 4);
            puVar21[5] = lVar7 + 1;
            *(undefined4 *)(puVar21 + 1) = uVar2;
            *(int *)((long)puVar21 + 0xc) = iVar13 + -1;
            puVar21[2] = uVar19 + 1;
            puVar21[3] = pwVar23;
            *(undefined4 *)(puVar21 + 4) = 4;
            *puVar21 = local_a8;
            local_a8 = puVar21;
          }
          pwVar23 = *(wchar_t **)(pwVar23 + 4);
        } while (pwVar23 != (wchar_t *)0x0);
      }
      if ((local_60 & 1) == 0) {
        free(__ptr);
      }
      plVar24 = local_38;
      local_60 = CONCAT71((int7)((ulong)local_a8 >> 8),local_a8 == (undefined8 *)0x0);
      __ptr = local_a8;
    } while (local_a8 != (undefined8 *)0x0);
    operator_delete__(buf);
    uVar19 = 0;
    plVar18 = plVar24;
    if (plVar24 != (long *)0x0) {
      do {
        uVar22 = ((int)uVar19 + 1) - (uint)((int)plVar18[1] == 0);
        uVar19 = (ulong)uVar22;
        plVar18 = (long *)*plVar18;
      } while (plVar18 != (long *)0x0);
      uVar19 = (ulong)uVar22;
    }
    vVar14 = CVmObjList::create(0,uVar19);
    this_00 = G_obj_table_X.pages_[vVar14 >> 0xc] + (vVar14 & 0xfff);
    uVar19 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
    if (uVar19 != 0) {
      CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar19 - 1);
    }
    pvVar11 = sp_;
    pvVar10 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar10 = VM_OBJ;
    (pvVar11->val).obj = vVar14;
    if (plVar24 != (long *)0x0) {
      iVar12 = 0;
      plVar18 = plVar24;
      do {
        if ((int)plVar18[1] != 0) {
          local_78.val.obj = CVmObjList::create(0,3);
          this_01 = (CVmObjList *)
                    ((long)&G_obj_table_X.pages_[local_78.val.obj >> 0xc]->ptr_ +
                    (ulong)((local_78.val.obj & 0xfff) * 0x18));
          local_78.typ = VM_OBJ;
          CVmObjList::cons_set_element((CVmObjList *)this_00,(long)iVar12,&local_78);
          local_68.p_ = (char *)0x0;
          sVar17 = utf8_ptr::setwchars(&local_68,(wchar_t *)(plVar18 + 3),plVar18[2],0);
          vVar15 = CVmObjString::create(0,sVar17);
          local_68.p_ = (char *)(*(long *)((long)&G_obj_table_X.pages_[vVar15 >> 0xc]
                                                  [vVar15 & 0xfff].ptr_ + 8) + 2);
          utf8_ptr::setwchars(&local_68,(wchar_t *)(plVar18 + 3),plVar18[2],sVar17);
          local_78.typ = VM_OBJ;
          local_78.val.obj = vVar15;
          CVmObjList::cons_set_element(this_01,0,&local_78);
          local_78.val.obj = *(undefined4 *)(plVar18 + 1);
          local_78.typ = VM_INT;
          CVmObjList::cons_set_element(this_01,1,&local_78);
          local_78.val.obj = *(vm_obj_id_t *)((long)plVar18 + 0xc);
          local_78.typ = VM_INT;
          CVmObjList::cons_set_element(this_01,2,&local_78);
          iVar12 = iVar12 + 1;
        }
        plVar18 = (long *)*plVar18;
      } while (plVar18 != (long *)0x0);
      do {
        plVar18 = (long *)*plVar24;
        free(plVar24);
        plVar24 = plVar18;
      } while (plVar18 != (long *)0x0);
    }
    local_48->typ = VM_OBJ;
    (local_48->val).obj = vVar14;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_correct(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    const char *str;
    size_t strl;
    int max_dist;
    static CVmNativeCodeDesc desc(2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the word string and maximum edit distance */
    str = CVmBif::pop_str_val(vmg0_);
    max_dist = CVmBif::pop_int_val(vmg0_);

    /* get the string length and character pointer */
    strl = vmb_get_len(str);
    str += VMB_LEN;

    /* for easier processing, convert the string to a wchar_t array */
    size_t wcnt = utf8_ptr::to_wcharz(0, 0, str, strl);
    wchar_t *wstr = new wchar_t[wcnt+1];
    utf8_ptr::to_wcharz(wstr, wcnt+1, str, strl);

    /* if we have a StringComparator, fetch it */
    CVmObjStrComp *cmp = 0;
    size_t trunc_len = 0;
    if (get_ext()->comparator_type_ == VMDICT_COMP_STRCOMP)
    {
        /* get the comparator */
        cmp = (CVmObjStrComp *)get_ext()->comparator_obj_;

        /* note the truncation length */
        trunc_len = cmp->trunc_len();
    }

    /* if we don't have the Trie yet, build it */
    if (get_ext()->trie_ == 0)
        build_trie(vmg0_);

    /* create a stack with the initial empty state */
    corr_stack stk(get_ext()->trie_);

    /* start with an empty result list */
    corr_word *results = 0;

    /* process states until the stack is empty */
    while (!stk.empty())
    {
        /* pop the next state */
        corr_state *s = stk.pop();

        /* 
         *   Check for an 'accept' state.  This is a state where we've
         *   exhausted the input word, and we're at a Trie node that has at
         *   least one word defined.
         */
        if (s->node->word_cnt != 0 && s->ipos == wcnt)
        {
            /*
             *   We've found a matching word (i.e., a candidate dictionary
             *   match for the misspelled input word).  Scan the list of
             *   candidates we've already found to see if we've already
             *   matched this word.
             */
            corr_word *w;
            for (w = results ; w != 0 ; w = w->nxt)
            {
                if (w->strl == s->strl
                    && memcmp(w->str, s->str, s->strl*sizeof(wchar_t)) == 0)
                    break;
            }

            /* if we didn't find an entry, add a new one */
            if (w == 0)
                results = w = new (s->strl) corr_word(
                    s->str, s->strl, s->dist, s->repl, results);

            /* keep the lowest edit distance we've found so far */
            if (s->dist < w->dist
                || (s->dist == w->dist && s->repl < w->repl))
            {
                w->dist = s->dist;
                w->repl = s->repl;
            }
        }

        /*
         *   If we have any edit distance left, try an insertion (i.e., the
         *   input word has an extra letter relative to the dictionary word).
         *   Don't do insertions directly after deletions, though, since
         *   they'd just cancel out.  
         */
        if (s->dist < max_dist && s->ipos < wcnt && s->typ != Deletion)
            stk.push(s->str, s->strl, s->dist + 1, s->repl, s->ipos + 1,
                     s->node, Insertion);

        /* try each possible dictionary transition from here */
        for (vmdict_TrieNode *chi = s->node->chi ; chi != 0 ;
             chi = chi->nxt)
        {
            /* 
             *   Build the next-state string.  Note that we can just add the
             *   character directly to the current state's string buffer,
             *   since we always allocate state structures with one extra
             *   character of padding for just this purpose. 
             */
            s->str[s->strl] = chi->ch;

            /* 
             *   Check for a match to the current character.  If we have a
             *   StringComparator, ask the comparator to check the match.
             *   Otherwise just check for an exact character match. 
             */
            size_t matchlen = 0;
            if (s->ipos < wcnt)
            {
                if (cmp != 0)
                {
                    /* we have a comparator - check it for the match */
                    matchlen = cmp->match_chars(
                        wstr + s->ipos, wcnt - s->ipos, chi->ch);
                }
                else
                {
                    /* no comparator - do a simple character comparison */
                    if (wstr[s->ipos] == chi->ch)
                        matchlen = 1;
                }
                
                /* if we have a match, push a state for it */
                if (matchlen != 0)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos + matchlen, chi, NoChange);
            }
            else
            {
                /* 
                 *   we've reached the end of the input; but if the current
                 *   edit string is at least the truncation length in the
                 *   string comparator, consider this a character match as
                 *   well 
                 */
                if (trunc_len != 0
                    && s->strl >= trunc_len
                    && s->ipos >= trunc_len)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos, chi, NoChange);
            }

            /* if we have any edit distance remaining, try corrections */
            if (s->dist < max_dist)
            {
                /* try a replaced letter */
                if (s->ipos < wcnt && matchlen == 0)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl + 1,
                             s->ipos + 1, chi, Replacement);

                /* try a deletion (i.e., the input is missing a character) */
                if (s->typ != Insertion)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl,
                             s->ipos, chi, Deletion);
            }

            /* 
             *   if we just did a replacement edit, check to see if it's
             *   actually a transposition 
             */
            if (s->typ == Replacement
                && s->ipos > 0 && s->ipos < wcnt
                && wstr[s->ipos - 1] == chi->ch
                && wstr[s->ipos] == s->str[s->strl - 1])
                stk.push(s->str, s->strl + 1, s->dist, s->repl - 1,
                         s->ipos + 1, chi, Transposition);
        }

        /* we've finished processing the current state */
        delete s;
    }

    /* done with the wchar_t version of the word */
    delete [] wstr;

    /* 
     *   Count up the number of result entries.  Only count words with a
     *   non-zero edit distance - words with a zero edit distance are already
     *   matches for the input word, so we can't consider them to be
     *   corrections for it. 
     */
    corr_word *r;
    int i;
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        /* if this word has a non-zero edit distance, count it */
        if (r->dist != 0)
            ++i;
    }

    /* allocate a List to hold the results */
    vm_obj_id_t lst_id = CVmObjList::create(vmg_ FALSE, i);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_id);
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push()->set_obj(lst_id);

    /* create a List [word, distance] for each result */
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        vm_val_t val;

        /* 
         *   If this word has a zero edit distance, skip it.  A word with a
         *   zero edit distance is already a match for the original, so it
         *   can't be considered a correction.  
         */
        if (r->dist == 0)
            continue;
        
        /* create the sublist */
        vm_obj_id_t sub_id = CVmObjList::create(vmg_ FALSE, 3);
        CVmObjList *sub = (CVmObjList *)vm_objp(vmg_ sub_id);

        /* add it to the main list */
        val.set_obj(sub_id);
        lst->cons_set_element(i, &val);

        /* measure the utf8 space needed for the string */
        utf8_ptr rp;
        size_t rplen = rp.setwchars(r->str, r->strl, 0);

        /* create the word string */
        vm_obj_id_t lstr_id = CVmObjString::create(vmg_ FALSE, rplen);
        CVmObjString *lstr = (CVmObjString *)vm_objp(vmg_ lstr_id);

        /* encode it */
        rp.set(lstr->cons_get_buf());
        rp.setwchars(r->str, r->strl, rplen);

        /* add it to the sublist */
        val.set_obj(lstr_id);
        sub->cons_set_element(0, &val);

        /* add the edit distance */
        val.set_int(r->dist);
        sub->cons_set_element(1, &val);

        /* add the character replacement count */
        val.set_int(r->repl);
        sub->cons_set_element(2, &val);

        /* count it */
        ++i;
    }

    /* delete the result list */
    while (results != 0)
    {
        /* unlink this element */
        r = results;
        results = results->nxt;

        /* delete it */
        delete r;
    }

    /* return the list value */
    retval->set_obj(lst_id);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}